

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O1

ListBuilder * __thiscall
capnp::_::OrphanBuilder::asList
          (ListBuilder *__return_storage_ptr__,OrphanBuilder *this,ElementSize elementSize)

{
  OrphanBuilder *pOVar1;
  ElementSize EVar2;
  ushort uVar3;
  StructPointerCount SVar4;
  ushort uVar5;
  ushort uVar6;
  SegmentId id;
  CapTableBuilder *pCVar7;
  uint64_t uVar8;
  int iVar9;
  SegmentBuilder *this_00;
  word *pwVar10;
  undefined7 in_register_00000011;
  ulong uVar11;
  OrphanBuilder *pOVar12;
  SegmentBuilder **ppSVar13;
  uint uVar14;
  ElementSize oldSize;
  uint local_7c;
  Fault f;
  unsigned_short dataSize;
  undefined2 uStack_6e;
  unsigned_short pointerCount;
  undefined2 uStack_6a;
  DebugComparison<capnp::_::WirePointer::Kind,_capnp::_::WirePointer::Kind> _kjCondition;
  
  uVar11 = CONCAT71(in_register_00000011,elementSize);
  uVar14 = (uint)(this->tag).content;
  id.value = *(uint *)((long)&(this->tag).content + 4);
  if (id.value != 0 || uVar14 != 0) {
    this_00 = this->segment;
    pCVar7 = this->capTable;
    local_7c = (uint)uVar11;
    if ((uVar14 & 3) == 2) {
      this_00 = BuilderArena::getSegment((BuilderArena *)(this_00->super_SegmentReader).arena,id);
      uVar14 = (uint)(this->tag).content;
      pwVar10 = (this_00->super_SegmentReader).ptr.ptr;
      uVar11 = (ulong)(uVar14 & 0xfffffff8);
      pOVar1 = (OrphanBuilder *)((long)&pwVar10->content + uVar11);
      pOVar12 = (OrphanBuilder *)((long)&pwVar10[1].content + uVar11);
      if ((uVar14 & 4) == 0) {
        pwVar10 = &pOVar12->tag + ((int)(pOVar1->tag).content >> 2);
        pOVar12 = pOVar1;
      }
      else {
        this_00 = BuilderArena::getSegment
                            ((BuilderArena *)(this_00->super_SegmentReader).arena,
                             (SegmentId)*(uint *)((long)&(pOVar1->tag).content + 4));
        pwVar10 = (word *)((long)&((this_00->super_SegmentReader).ptr.ptr)->content +
                          (ulong)((uint)(pOVar1->tag).content & 0xfffffff8));
      }
      uVar11 = (ulong)local_7c;
    }
    else {
      pwVar10 = this->location;
      pOVar12 = this;
    }
    if (this_00->readOnly == true) {
      SegmentBuilder::throwNotWritable(this_00);
    }
    _kjCondition.left = (Kind)(pOVar12->tag).content & OTHER;
    _kjCondition.right = LIST;
    _kjCondition.op.content.ptr = " == ";
    _kjCondition.op.content.size_ = 5;
    _kjCondition.result = _kjCondition.left == LIST;
    if (_kjCondition.left != LIST) {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::WirePointer::Kind,capnp::_::WirePointer::Kind>&,char_const(&)[85]>
                (&f,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                 ,0x509,FAILED,"ref->kind() == WirePointer::LIST",
                 "_kjCondition,\"Schema mismatch: Called getWritableListPointer() but existing pointer is not a list.\""
                 ,&_kjCondition,
                 (char (*) [85])
                 "Schema mismatch: Called getWritableListPointer() but existing pointer is not a list."
                );
      kj::_::Debug::Fault::~Fault(&f);
      uVar11 = (ulong)local_7c;
      iVar9 = 4;
      goto LAB_0036fcf2;
    }
    EVar2 = *(ElementSize *)((long)&(pOVar12->tag).content + 4);
    oldSize = EVar2 & INLINE_COMPOSITE;
    if (oldSize == INLINE_COMPOSITE) {
      _kjCondition.left = (uint)pwVar10->content & 3;
      _kjCondition.right = STRUCT;
      _kjCondition.op.content.ptr = " == ";
      _kjCondition.op.content.size_ = 5;
      _kjCondition.result = _kjCondition.left == 0;
      if (_kjCondition.left != 0) {
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::WirePointer::Kind,capnp::_::WirePointer::Kind>&,char_const(&)[62]>
                  (&f,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                   ,0x518,FAILED,"tag->kind() == WirePointer::STRUCT",
                   "_kjCondition,\"INLINE_COMPOSITE list with non-STRUCT elements not supported.\"",
                   &_kjCondition,
                   (char (*) [62])"INLINE_COMPOSITE list with non-STRUCT elements not supported.");
        kj::_::Debug::Fault::fatal(&f);
      }
      ppSVar13 = (SegmentBuilder **)(pwVar10 + 1);
      uVar3 = *(ushort *)((long)&pwVar10->content + 4);
      _dataSize = CONCAT22(uStack_6e,uVar3);
      SVar4 = *(StructPointerCount *)((long)&pwVar10->content + 6);
      _pointerCount = CONCAT22(uStack_6a,SVar4);
      switch((uint)uVar11 & 0xff) {
      case 1:
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[123]>
                  ((Fault *)&_kjCondition,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                   ,0x526,FAILED,(char *)0x0,
                   "\"Schema mismatch: Found struct list where bit list was expected; upgrading boolean \" \"lists to structs is no longer supported.\""
                   ,(char (*) [123])
                    "Schema mismatch: Found struct list where bit list was expected; upgrading boolean lists to structs is no longer supported."
                  );
        kj::_::Debug::Fault::~Fault((Fault *)&_kjCondition);
        uVar11 = (ulong)local_7c;
        iVar9 = 4;
        break;
      case 2:
      case 3:
      case 4:
      case 5:
        _kjCondition._0_8_ = &dataSize;
        _kjCondition.op.content.ptr = (char *)0x1;
        _kjCondition.op.content.size_ = (size_t)anon_var_dwarf_2a7a95;
        _kjCondition.result = true;
        _kjCondition._25_7_ = 0;
        if (uVar3 != 0) goto switchD_0036f838_default;
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_short&,unsigned_int>&,char_const(&)[73]>
                  (&f,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                   ,0x530,FAILED,"dataSize >= ONE * WORDS",
                   "_kjCondition,\"Schema mismatch: Existing list value is incompatible with expected type.\""
                   ,(DebugComparison<unsigned_short_&,_unsigned_int> *)&_kjCondition,
                   (char (*) [73])
                   "Schema mismatch: Existing list value is incompatible with expected type.");
        kj::_::Debug::Fault::~Fault(&f);
        uVar11 = (ulong)local_7c;
        iVar9 = 4;
        break;
      case 6:
        _kjCondition._0_8_ = &pointerCount;
        _kjCondition.op.content.ptr = (char *)0x1;
        _kjCondition.op.content.size_ = (size_t)anon_var_dwarf_2a7a95;
        _kjCondition.result = true;
        _kjCondition._25_7_ = 0;
        if (SVar4 != 0) {
          ppSVar13 = ppSVar13 + uVar3;
          goto switchD_0036f838_default;
        }
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_short&,unsigned_int>&,char_const(&)[73]>
                  (&f,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                   ,0x537,FAILED,"pointerCount >= ONE * POINTERS",
                   "_kjCondition,\"Schema mismatch: Existing list value is incompatible with expected type.\""
                   ,(DebugComparison<unsigned_short_&,_unsigned_int> *)&_kjCondition,
                   (char (*) [73])
                   "Schema mismatch: Existing list value is incompatible with expected type.");
        kj::_::Debug::Fault::~Fault(&f);
        uVar11 = (ulong)local_7c;
        iVar9 = 4;
        break;
      case 7:
        kj::_::unreachable();
      default:
switchD_0036f838_default:
        uVar5 = *(ushort *)((long)&pwVar10->content + 4);
        uVar6 = *(ushort *)((long)&pwVar10->content + 6);
        uVar8 = pwVar10->content;
        __return_storage_ptr__->segment = this_00;
        __return_storage_ptr__->capTable = pCVar7;
        __return_storage_ptr__->ptr = (byte *)ppSVar13;
        __return_storage_ptr__->elementCount = (uint)uVar8 >> 2 & 0x1fffffff;
        __return_storage_ptr__->step = ((uint)uVar6 + (uint)uVar5) * 0x40;
        __return_storage_ptr__->structDataSize = (uint)uVar3 << 6;
        __return_storage_ptr__->structPointerCount = SVar4;
        __return_storage_ptr__->elementSize = INLINE_COMPOSITE;
LAB_0036fa10:
        iVar9 = 1;
      }
    }
    else {
      _dataSize = (&BITS_PER_ELEMENT_TABLE)[(ulong)EVar2 & 7];
      _pointerCount = (uint)(oldSize == POINTER);
      _kjCondition._0_8_ = &oldSize;
      if ((char)uVar11 == '\x01') {
        _kjCondition.op.content.ptr = (char *)((long)&_IO_stdin_used + 1);
        _kjCondition.op.content.size_ = (size_t)anon_var_dwarf_3a16;
        _kjCondition.result = true;
        _kjCondition._25_7_ = 0;
        if (oldSize == BIT) {
LAB_0036f9d1:
          uVar14 = *(uint *)((long)&(pOVar12->tag).content + 4);
          __return_storage_ptr__->segment = this_00;
          __return_storage_ptr__->capTable = pCVar7;
          __return_storage_ptr__->ptr = (byte *)pwVar10;
          __return_storage_ptr__->elementCount = uVar14 >> 3;
          __return_storage_ptr__->step = _pointerCount * 0x40 + _dataSize;
          __return_storage_ptr__->structDataSize = _dataSize;
          __return_storage_ptr__->structPointerCount = (ushort)(oldSize == POINTER);
          __return_storage_ptr__->elementSize = oldSize;
          goto LAB_0036fa10;
        }
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::ElementSize&,capnp::ElementSize>&,char_const(&)[65]>
                  (&f,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                   ,0x54e,FAILED,"oldSize == ElementSize::BIT",
                   "_kjCondition,\"Schema mismatch: Found non-bit list where bit list was expected.\""
                   ,(DebugComparison<capnp::ElementSize_&,_capnp::ElementSize> *)&_kjCondition,
                   (char (*) [65])"Schema mismatch: Found non-bit list where bit list was expected."
                  );
        kj::_::Debug::Fault::~Fault(&f);
        uVar11 = (ulong)local_7c;
        iVar9 = 4;
      }
      else {
        _kjCondition.op.content.ptr = (char *)((long)&_IO_stdin_used + 1);
        _kjCondition.op.content.size_ = (size_t)anon_var_dwarf_44bf6;
        _kjCondition.result = true;
        _kjCondition._25_7_ = 0;
        if (oldSize == BIT) {
          kj::_::Debug::Fault::
          Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::ElementSize&,capnp::ElementSize>&,char_const(&)[65]>
                    (&f,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                     ,0x553,FAILED,"oldSize != ElementSize::BIT",
                     "_kjCondition,\"Schema mismatch: Found bit list where non-bit list was expected.\""
                     ,(DebugComparison<capnp::ElementSize_&,_capnp::ElementSize> *)&_kjCondition,
                     (char (*) [65])
                     "Schema mismatch: Found bit list where non-bit list was expected.");
          kj::_::Debug::Fault::~Fault(&f);
          uVar11 = (ulong)local_7c;
          iVar9 = 4;
        }
        else {
          _kjCondition._0_8_ = &dataSize;
          _kjCondition.op.content.ptr =
               (char *)(ulong)(uint)(&BITS_PER_ELEMENT_TABLE)[uVar11 & 0xff];
          _kjCondition.op.content.size_ = (size_t)anon_var_dwarf_2a7a95;
          _kjCondition.result = true;
          _kjCondition._25_7_ = 0;
          if (_dataSize < (uint)(&BITS_PER_ELEMENT_TABLE)[uVar11 & 0xff]) {
            kj::_::Debug::Fault::
            Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int&,unsigned_int>&,char_const(&)[73]>
                      (&f,
                       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                       ,0x557,FAILED,"dataSize >= dataBitsPerElement(elementSize) * ELEMENTS",
                       "_kjCondition,\"Schema mismatch: Existing list value is incompatible with expected type.\""
                       ,(DebugComparison<unsigned_int_&,_unsigned_int> *)&_kjCondition,
                       (char (*) [73])
                       "Schema mismatch: Existing list value is incompatible with expected type.");
            kj::_::Debug::Fault::~Fault(&f);
            uVar11 = (ulong)local_7c;
            iVar9 = 4;
          }
          else {
            _kjCondition._0_8_ = &pointerCount;
            uVar14 = (uint)((char)uVar11 == '\x06');
            _kjCondition.op.content.ptr = (char *)(ulong)uVar14;
            _kjCondition.op.content.size_ = (size_t)anon_var_dwarf_2a7a95;
            _kjCondition.result = true;
            _kjCondition._25_7_ = 0;
            if (uVar14 <= _pointerCount) goto LAB_0036f9d1;
            kj::_::Debug::Fault::
            Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int&,unsigned_int>&,char_const(&)[73]>
                      (&f,
                       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                       ,0x55b,FAILED,"pointerCount >= pointersPerElement(elementSize) * ELEMENTS",
                       "_kjCondition,\"Schema mismatch: Existing list value is incompatible with expected type.\""
                       ,(DebugComparison<unsigned_int_&,_unsigned_int> *)&_kjCondition,
                       (char (*) [73])
                       "Schema mismatch: Existing list value is incompatible with expected type.");
            kj::_::Debug::Fault::~Fault(&f);
            uVar11 = (ulong)local_7c;
            iVar9 = 4;
          }
        }
      }
    }
LAB_0036fcf2:
    if (iVar9 != 4) goto LAB_0036fd0c;
  }
  __return_storage_ptr__->ptr = (byte *)0x0;
  __return_storage_ptr__->elementCount = 0;
  __return_storage_ptr__->step = 0;
  __return_storage_ptr__->segment = (SegmentBuilder *)0x0;
  __return_storage_ptr__->capTable = (CapTableBuilder *)0x0;
  *(undefined8 *)((long)&__return_storage_ptr__->step + 2) = 0;
  __return_storage_ptr__->elementSize = (ElementSize)uVar11;
LAB_0036fd0c:
  if ((__return_storage_ptr__->elementSize == INLINE_COMPOSITE) &&
     (__return_storage_ptr__->ptr != (byte *)0x0)) {
    pwVar10 = (word *)(__return_storage_ptr__->ptr + -8);
  }
  else {
    pwVar10 = (word *)__return_storage_ptr__->ptr;
  }
  this->location = pwVar10;
  return __return_storage_ptr__;
}

Assistant:

ListBuilder OrphanBuilder::asList(ElementSize elementSize) {
  KJ_DASSERT(tagAsPtr()->isNull() == (location == nullptr));

  ListBuilder result = WireHelpers::getWritableListPointer(
      tagAsPtr(), location, segment, capTable, elementSize, nullptr, segment->getArena());

  // Watch out, the pointer could have been updated if the object had to be relocated.
  // (Actually, currently this is not true for primitive lists, but let's not turn into a bug if
  // it changes!)
  location = result.getLocation();

  return result;
}